

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O1

mg_str * mg_get_http_header(http_message *hm,char *name)

{
  bool bVar1;
  int iVar2;
  size_t len;
  size_t sVar3;
  mg_str *unaff_R12;
  mg_str *pmVar4;
  
  len = strlen(name);
  sVar3 = hm->header_names[0].len;
  if (sVar3 != 0) {
    pmVar4 = hm->header_values;
    do {
      if ((sVar3 == len && pmVar4[-0x28].p != (char *)0x0) &&
         (iVar2 = mg_ncasecmp(pmVar4[-0x28].p,name,len), iVar2 == 0)) {
        bVar1 = false;
        unaff_R12 = pmVar4;
      }
      else {
        bVar1 = true;
      }
      if (!bVar1) {
        return unaff_R12;
      }
      sVar3 = pmVar4[-0x27].len;
      pmVar4 = pmVar4 + 1;
    } while (sVar3 != 0);
  }
  return (mg_str *)0x0;
}

Assistant:

struct mg_str *mg_get_http_header(struct http_message *hm, const char *name) {
    size_t i, len = strlen(name);

    for (i = 0; hm->header_names[i].len > 0; i++) {
        struct mg_str *h = &hm->header_names[i], *v = &hm->header_values[i];
        if (h->p != NULL && h->len == len && !mg_ncasecmp(h->p, name, len))
            return v;
    }

    return NULL;
}